

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void parsePSPFile(filebuf *file)

{
  bool bVar1;
  ushort uVar2;
  optional<Rgba> oVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  __integer_from_chars_result_type<unsigned_long> _Var7;
  string line;
  size_type local_48;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_40;
  unsigned_long local_38;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  readLine(file,&line);
  bVar1 = std::operator==(&line,"JASC-PAL");
  if (bVar1) {
    line._M_string_length = 0;
    *line._M_dataplus._M_p = '\0';
    readLine(file,&line);
    bVar1 = std::operator==(&line,"0100");
    if (bVar1) {
      line._M_string_length = 0;
      *line._M_dataplus._M_p = '\0';
      readLine(file,&line);
      local_38 = 0;
      _Var7 = std::from_chars<unsigned_long>
                        (line._M_dataplus._M_p,line._M_dataplus._M_p + line._M_string_length,
                         &local_38,10);
      if ((_Var7.ec == 0) &&
         ((long)_Var7.ptr - (long)line._M_dataplus._M_p == line._M_string_length)) {
        uVar2 = (ushort)local_38;
        if ((uint)options.nbPalettes * (uint)options.nbColorsPerPal < ((uint)local_38 & 0xffff)) {
          warning("PSP file contains %u colors, but there can only be %u; ignoring extra");
          uVar2 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
        }
        if (options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          options.palSpec.
          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               options.palSpec.
               super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        uVar5 = 0;
        local_40 = &options.palSpec;
        for (uVar6 = 1; uVar6 - uVar2 != 1; uVar6 = uVar6 + 1) {
          line._M_string_length = 0;
          *line._M_dataplus._M_p = '\0';
          readLine(file,&line);
          local_48 = 0;
          oVar3 = parseColor(&line,&local_48,(uint16_t)uVar6);
          if (((uint5)oVar3.super__Optional_base<Rgba,_true,_true>._M_payload.
                      super__Optional_payload_base<Rgba> & 0x100000000) == 0) break;
          if (local_48 != line._M_string_length) {
            error("Failed to parse color #%u (\"%s\"): trailing characters after blue component",
                  (ulong)uVar6,line._M_dataplus._M_p);
            break;
          }
          uVar4 = (ushort)((uVar5 & 0xffff) % (uint)options.nbColorsPerPal);
          if (uVar4 == 0) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            emplace_back<>(local_40);
            uVar4 = (ushort)((uVar5 & 0xffff) % (uint)options.nbColorsPerPal);
          }
          *(_Storage<Rgba,_true> *)
           (options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + uVar4) =
               oVar3.super__Optional_base<Rgba,_true,_true>._M_payload.
               super__Optional_payload_base<Rgba>._M_payload;
          uVar5 = uVar5 + 1;
        }
      }
      else {
        error("Invalid \"number of colors\" line in PSP file (%s)",line._M_dataplus._M_p);
      }
    }
    else {
      error("Unsupported PSP palette file version \"%s\"",line._M_dataplus._M_p);
    }
  }
  else {
    error("Palette file does not appear to be a PSP palette file");
  }
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

static void parsePSPFile(std::filebuf &file) {
	// https://www.selapa.net/swatches/colors/fileformats.php#psp_pal

	std::string line;
	readLine(file, line);
	if (line != "JASC-PAL") {
		error("Palette file does not appear to be a PSP palette file");
		return;
	}

	line.clear();
	readLine(file, line);
	if (line != "0100") {
		error("Unsupported PSP palette file version \"%s\"", line.c_str());
		return;
	}

	line.clear();
	readLine(file, line);
	std::string::size_type n = 0;
	std::optional<uint16_t> nbColors = parseDec<uint16_t>(line, n);
	if (!nbColors || n != line.length()) {
		error("Invalid \"number of colors\" line in PSP file (%s)", line.c_str());
		return;
	}

	if (*nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("PSP file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        *nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();

	for (uint16_t i = 0; i < *nbColors; ++i) {
		line.clear();
		readLine(file, line);

		n = 0;
		std::optional<Rgba> color = parseColor(line, n, i + 1);
		if (!color) {
			return;
		}
		if (n != line.length()) {
			error("Failed to parse color #%" PRIu16
			      " (\"%s\"): trailing characters after blue component",
			      i + 1, line.c_str());
			return;
		}

		if (i % options.nbColorsPerPal == 0) {
			options.palSpec.emplace_back();
		}
		options.palSpec.back()[i % options.nbColorsPerPal] = *color;
	}
}